

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketsOps.cpp
# Opt level: O3

sz_ssize_t sznet::net::sockets::sz_readv(sz_sock sockfd,sz_iov_type *iov,int iovcnt)

{
  ssize_t sVar1;
  
  sVar1 = readv(sockfd,(iovec *)iov,iovcnt);
  return sVar1;
}

Assistant:

sz_ssize_t sz_readv(sz_sock sockfd, sz_iov_type* iov, int iovcnt)
{
#ifdef SZ_OS_WINDOWS
	DWORD bytesRead;
	DWORD flags = 0;
	if (WSARecv(sockfd, iov, iovcnt, &bytesRead, &flags, nullptr, nullptr) != 0)
	{
		return -1;
	}
	return bytesRead;
#else
	return ::readv(sockfd, iov, iovcnt);
#endif
}